

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O0

void __thiscall Liby::UdpSocket::handleReadEvent(UdpSocket *this)

{
  bool bVar1;
  int iVar2;
  element_type *this_00;
  ssize_t sVar3;
  int *piVar4;
  pointer ppVar5;
  element_type *peVar6;
  Buffer *pBVar7;
  socklen_t *in_stack_ffffffffffffef08;
  UdpConnection *uconn_1;
  pair<Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_> local_1088;
  Endpoint local_1070;
  undefined1 local_1068 [8];
  shared_ptr<Liby::UdpConnection> uconn;
  _Self local_1050;
  iterator it;
  Endpoint peer;
  char local_1028 [4];
  int n;
  char buffer [4096];
  undefined1 local_20 [8];
  shared_ptr<Liby::UdpSocket> self;
  UdpSocket *this_local;
  
  self.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::shared_ptr<Liby::UdpSocket>::shared_ptr((shared_ptr<Liby::UdpSocket> *)local_20,&this->self_)
  ;
  while( true ) {
    this_00 = std::__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->socket_);
    sVar3 = Socket::recvfrom(this_00,(int)local_1028,(void *)0x1000,0,0x195748,
                             (sockaddr *)&handleReadEvent::addr_len,in_stack_ffffffffffffef08);
    iVar2 = (int)sVar3;
    if (iVar2 < 0) break;
    Endpoint::Endpoint((Endpoint *)((long)&it._M_node + 4),&handleReadEvent::address);
    local_1050._M_node =
         (_Base_ptr)
         std::
         map<Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>,_std::less<Liby::Endpoint>,_std::allocator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>_>
         ::find(&this->conns_,(key_type *)((long)&it._M_node + 4));
    uconn.super___shared_ptr<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         map<Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>,_std::less<Liby::Endpoint>,_std::allocator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>_>
         ::end(&this->conns_);
    bVar1 = std::operator==(&local_1050,
                            (_Self *)&uconn.
                                      super___shared_ptr<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
    if (bVar1) {
      local_1070 = (Endpoint)this;
      std::make_shared<Liby::UdpConnection,Liby::UdpSocket*,Liby::Endpoint&>
                ((UdpSocket **)local_1068,&local_1070);
      std::make_pair<Liby::Endpoint&,std::shared_ptr<Liby::UdpConnection>&>
                (&local_1088,(Endpoint *)((long)&it._M_node + 4),
                 (shared_ptr<Liby::UdpConnection> *)local_1068);
      std::
      map<Liby::Endpoint,std::shared_ptr<Liby::UdpConnection>,std::less<Liby::Endpoint>,std::allocator<std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>>>
      ::insert<std::pair<Liby::Endpoint,std::shared_ptr<Liby::UdpConnection>>>
                ((map<Liby::Endpoint,std::shared_ptr<Liby::UdpConnection>,std::less<Liby::Endpoint>,std::allocator<std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>>>
                  *)&this->conns_,&local_1088);
      std::pair<Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>::~pair(&local_1088);
      bVar1 = std::function::operator_cast_to_bool((function *)&this->acceptorCallback_);
      if (bVar1) {
        peVar6 = std::
                 __shared_ptr_access<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_1068);
        std::function<void_(Liby::UdpConnection_&)>::operator()(&this->acceptorCallback_,peVar6);
      }
      peVar6 = std::
               __shared_ptr_access<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_1068);
      pBVar7 = UdpConnection::getReadBuf(peVar6);
      Buffer::append(pBVar7,local_1028,(long)iVar2);
      bVar1 = std::function::operator_cast_to_bool((function *)&this->readEventCallback_);
      if (bVar1) {
        peVar6 = std::
                 __shared_ptr_access<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_1068);
        std::function<void_(Liby::UdpConnection_&)>::operator()(&this->readEventCallback_,peVar6);
      }
      std::shared_ptr<Liby::UdpConnection>::~shared_ptr
                ((shared_ptr<Liby::UdpConnection> *)local_1068);
    }
    else {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>
               ::operator->(&local_1050);
      peVar6 = std::
               __shared_ptr_access<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&ppVar5->second);
      pBVar7 = UdpConnection::getReadBuf(peVar6);
      Buffer::append(pBVar7,local_1028,(long)iVar2);
      bVar1 = std::function::operator_cast_to_bool((function *)&this->readEventCallback_);
      if (bVar1) {
        std::function<void_(Liby::UdpConnection_&)>::operator()(&this->readEventCallback_,peVar6);
      }
    }
  }
  piVar4 = __errno_location();
  if (*piVar4 != 0xb) {
    handleErroEvent(this);
  }
  std::shared_ptr<Liby::UdpSocket>::~shared_ptr((shared_ptr<Liby::UdpSocket> *)local_20);
  return;
}

Assistant:

void UdpSocket::handleReadEvent() {
    auto self = self_;

    char buffer[4096];

    for (;;) {
        static struct sockaddr_in address;
        static socklen_t addr_len = sizeof(struct sockaddr_in);

        int n = socket_->recvfrom(buffer, sizeof(buffer), 0,
                                  (struct sockaddr *)&address, &addr_len);

        if (n < 0) {
            if (errno != EAGAIN) {
                handleErroEvent();
            }
            break;
        }

        Endpoint peer(&address);
        auto it = conns_.find(peer);
        if (it == conns_.end()) {
            // a new udp conn
            auto uconn = std::make_shared<UdpConnection>(this, peer);
            conns_.insert(std::make_pair(peer, uconn));
            if (acceptorCallback_) {
                acceptorCallback_(*uconn);
            }
            uconn->getReadBuf().append(buffer, n);
            if (readEventCallback_) {
                readEventCallback_(*uconn);
            }
        } else {
            UdpConnection &uconn = *(it->second);
            uconn.getReadBuf().append(buffer, n);
            if (readEventCallback_) {
                readEventCallback_(uconn);
            }
        }
    }
}